

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolver.cpp
# Opt level: O1

void __thiscall
libtorrent::resolver::on_lookup
          (resolver *this,error_code *ec,iterator *i,callback_t *h,string *hostname)

{
  long lVar1;
  pointer paVar2;
  element_type *peVar3;
  long lVar4;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>,_true>
  _Var5;
  mapped_type *pmVar6;
  time_point tVar7;
  long lVar8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>,_true>
  __it;
  resolver *this_00;
  address local_68;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_40;
  callback_t *local_38;
  
  if (ec->failed_ == true) {
    local_68._0_8_ = (pointer)0x0;
    local_68.ipv6_address_.addr_.__in6_u._0_8_ = (pointer)0x0;
    local_68.ipv6_address_.addr_.__in6_u._8_8_ = (pointer)0x0;
    callback(this,h,ec,
             (vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *)
             &local_68);
    if ((pointer)local_68._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_68._0_8_,
                      local_68.ipv6_address_.addr_.__in6_u._8_8_ - local_68._0_8_);
    }
  }
  else {
    this_00 = (resolver *)&this->m_cache;
    local_40 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)this_00;
    local_38 = h;
    pmVar6 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this_00,hostname);
    tVar7 = aux::time_now();
    (pmVar6->last_seen).__d.__r = (rep)tVar7.__d.__r;
    paVar2 = (pmVar6->addresses).
             super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((pmVar6->addresses).
        super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>.
        _M_impl.super__Vector_impl_data._M_finish != paVar2) {
      (pmVar6->addresses).
      super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>.
      _M_impl.super__Vector_impl_data._M_finish = paVar2;
    }
    peVar3 = (i->values_).
             super___shared_ptr<std::vector<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    while (peVar3 != (element_type *)0x0) {
      lVar4 = (long)(((i->values_).
                      super___shared_ptr<std::vector<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->
                    super__Vector_base<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
      lVar8 = i->index_ * 0x60;
      lVar1 = lVar4 + lVar8;
      if (*(short *)(lVar4 + lVar8) == 2) {
        local_68._0_8_ = (ulong)*(uint *)(lVar1 + 4) << 0x20;
        local_68.ipv6_address_.addr_.__in6_u._0_8_ = (pointer)0x0;
        local_68.ipv6_address_.addr_.__in6_u._8_8_ = (pointer)0x0;
        local_68.ipv6_address_.scope_id_ = 0;
      }
      else {
        local_68.ipv6_address_.scope_id_ = (unsigned_long)*(uint *)(lVar1 + 0x18);
        local_68.ipv6_address_.addr_.__in6_u._0_8_ = *(undefined8 *)(lVar1 + 8);
        local_68.ipv6_address_.addr_.__in6_u._8_8_ = *(undefined8 *)(lVar1 + 0x10);
        local_68._0_8_ = (pointer)0x1;
      }
      std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>::
      emplace_back<boost::asio::ip::address>(&pmVar6->addresses,&local_68);
      this_00 = (resolver *)i;
      boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>::increment(i);
      peVar3 = (i->values_).
               super___shared_ptr<std::vector<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
    }
    callback(this_00,local_38,ec,&pmVar6->addresses);
    if (this->m_max_size < (int)(this->m_cache)._M_h._M_element_count) {
      _Var5._M_cur = (__node_type *)(this->m_cache)._M_h._M_before_begin._M_nxt;
      __it._M_cur = _Var5._M_cur;
      for (; _Var5._M_cur != (__node_type *)0x0;
          _Var5._M_cur = (__node_type *)((_Var5._M_cur)->super__Hash_node_base)._M_nxt) {
        if (*(long *)((long)&((_Var5._M_cur)->
                             super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>,_true>
                             ).
                             super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>_>
                             ._M_storage._M_storage + 0x20) < *(long *)((long)__it._M_cur + 0x28)) {
          __it._M_cur = _Var5._M_cur;
        }
      }
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::erase(local_40,(const_iterator)__it._M_cur);
    }
  }
  return;
}

Assistant:

void resolver::on_lookup(error_code const& ec, tcp::resolver::iterator i
		, resolver_interface::callback_t const& h, std::string const& hostname)
	{
		COMPLETE_ASYNC("resolver::on_lookup");
		if (ec)
		{
			callback(h, ec, {});
			return;
		}

		dns_cache_entry& ce = m_cache[hostname];
		ce.last_seen = aux::time_now();
		ce.addresses.clear();
		while (i != tcp::resolver::iterator())
		{
			ce.addresses.push_back(i->endpoint().address());
			++i;
		}

		callback(h, ec, ce.addresses);

		// if m_cache grows too big, weed out the
		// oldest entries
		if (int(m_cache.size()) > m_max_size)
		{
			auto oldest = m_cache.begin();
			for (auto k = m_cache.begin(); k != m_cache.end(); ++k)
			{
				if (k->second.last_seen < oldest->second.last_seen)
					oldest = k;
			}

			// remove the oldest entry
			m_cache.erase(oldest);
		}
	}